

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

void anon_unknown.dwarf_13f3f::DecompressZip
               (uchar *dst,unsigned_long *uncompressedSize,uchar *src,unsigned_long srcSize)

{
  unsigned_long uVar1;
  reference pvVar2;
  reference pvVar3;
  value_type *pvVar4;
  long lVar5;
  reference pvVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpBuf;
  allocator_type local_41;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,*uncompressedSize,
             &local_41);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,0);
  mz_uncompress(pvVar2,uncompressedSize,src,srcSize);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,0);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,0);
  uVar1 = *uncompressedSize;
  while (pvVar6 = pvVar2 + 1, pvVar6 < pvVar3 + uVar1) {
    *pvVar6 = *pvVar6 + *pvVar2 + 0x80;
    pvVar2 = pvVar6;
  }
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,0);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,0);
  uVar1 = *uncompressedSize;
  pvVar4 = dst + uVar1;
  lVar5 = 0;
  for (; dst < pvVar4; dst = dst + 2) {
    *dst = pvVar2[lVar5];
    if (pvVar4 <= dst + 1) break;
    dst[1] = pvVar3[lVar5 + (uVar1 + 1 >> 1)];
    lVar5 = lVar5 + 1;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

void DecompressZip(unsigned char *dst, unsigned long &uncompressedSize,
                   const unsigned char *src, unsigned long srcSize) {
  std::vector<unsigned char> tmpBuf(uncompressedSize);

  int ret =
      miniz::mz_uncompress(&tmpBuf.at(0), &uncompressedSize, src, srcSize);
  assert(ret == miniz::MZ_OK);
  (void)ret;

  //
  // Apply EXR-specific? postprocess. Grabbed from OpenEXR's
  // ImfZipCompressor.cpp
  //

  // Predictor.
  {
    unsigned char *t = &tmpBuf.at(0) + 1;
    unsigned char *stop = &tmpBuf.at(0) + uncompressedSize;

    while (t < stop) {
      int d = int(t[-1]) + int(t[0]) - 128;
      t[0] = d;
      ++t;
    }
  }

  // Reorder the pixel data.
  {
    const char *t1 = reinterpret_cast<const char *>(&tmpBuf.at(0));
    const char *t2 = reinterpret_cast<const char *>(&tmpBuf.at(0)) +
                     (uncompressedSize + 1) / 2;
    char *s = reinterpret_cast<char *>(dst);
    char *stop = s + uncompressedSize;

    for(;;) {
      if (s < stop)
        *(s++) = *(t1++);
      else
        break;

      if (s < stop)
        *(s++) = *(t2++);
      else
        break;
    }
  }
}